

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O2

Result * CoreML::validateRegressorInterface
                   (Result *__return_storage_ptr__,ModelDescription *description,int modelVersion,
                   ValidationPolicy *validationPolicy)

{
  void *pvVar1;
  bool bVar2;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  allocator_type local_69;
  undefined1 local_68 [24];
  undefined1 local_50 [40];
  TypeCase local_28 [2];
  
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((ulong)(description->predictedfeaturename_).tagged_ptr_.ptr_ &
                          0xfffffffffffffffe),"");
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,"Specification is missing regressor predictedFeatureName.",
               (allocator<char> *)local_68);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    validateFeatureDescriptions<CoreML::Specification::ModelDescription>
              (__return_storage_ptr__,description,modelVersion,validationPolicy);
    bVar2 = Result::good(__return_storage_ptr__);
    if (bVar2) {
      pvVar1 = (description->predictedfeaturename_).tagged_ptr_.ptr_;
      local_28[0] = kDoubleType;
      local_28[1] = kMultiArrayType;
      __l._M_len = 2;
      __l._M_array = local_28;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_68,__l,&local_69);
      validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_50,(CoreML *)&description->output_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
                 ((ulong)pvVar1 & 0xfffffffffffffffe),(string *)local_68,in_R8);
      Result::operator=(__return_storage_ptr__,(Result *)local_50);
      std::__cxx11::string::~string((string *)(local_50 + 8));
      std::
      _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                       *)local_68);
      Result::good(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateRegressorInterface(const Specification::ModelDescription& description, int modelVersion, const ValidationPolicy& validationPolicy) {

        if (description.predictedfeaturename() == "") {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Specification is missing regressor predictedFeatureName.");
        }

        // Validate feature descriptions
        Result result = validateFeatureDescriptions(description, modelVersion, validationPolicy);
        if (!result.good()) {
            return result;
        }

        result = validateDescriptionsContainFeatureWithNameAndType(description.output(),
                                                                   description.predictedfeaturename(),
                                                                   {Specification::FeatureType::kDoubleType, Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        return result;
    }